

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O3

nng_err nng_http_hijack(nng_http *conn)

{
  nng_err nVar1;
  
  nVar1 = nni_http_hijack(conn);
  return nVar1;
}

Assistant:

nng_err
nng_http_hijack(nng_http *conn)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_hijack(conn));
#else
	NNI_ARG_UNUSED(conn);
	return (NNG_ENOTSUP);
#endif
}